

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O2

void __thiscall
RegisterDepfileParserTestCarriageReturnContinuation::
RegisterDepfileParserTestCarriageReturnContinuation
          (RegisterDepfileParserTestCarriageReturnContinuation *this)

{
  RegisterTest(DepfileParserTestCarriageReturnContinuation::Create,
               "DepfileParserTest.CarriageReturnContinuation");
  return;
}

Assistant:

TEST_F(DepfileParserTest, CarriageReturnContinuation) {
  string err;
  EXPECT_TRUE(Parse(
"foo.o: \\\r\n"
"  bar.h baz.h\r\n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("foo.o", parser_.outs_[0].AsString());
  EXPECT_EQ(2u, parser_.ins_.size());
}